

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cc
# Opt level: O1

bool benchmark::anon_unknown_1::ReadIntFromFile(char *file,long *value)

{
  int __fd;
  ssize_t sVar1;
  long lVar2;
  bool bVar3;
  char *err;
  char line [1024];
  CheckHandler CStack_438;
  char *local_430;
  char local_428 [1032];
  
  bVar3 = false;
  __fd = open(file,0);
  if (__fd != -1) {
    memset(local_428,0,0x400);
    sVar1 = read(__fd,local_428,0x3ff);
    if (sVar1 == 0) {
      internal::CheckHandler::CheckHandler
                (&CStack_438,"read(fd, line, sizeof(line) - 1)",
                 "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/sysinfo.cc"
                 ,"ReadIntFromFile",0x4f);
      internal::CheckHandler::~CheckHandler(&CStack_438);
    }
    internal::GetNullLogInstance();
    lVar2 = strtol(local_428,&local_430,10);
    if ((local_428[0] == '\0') || ((*local_430 != '\n' && (*local_430 != '\0')))) {
      bVar3 = false;
    }
    else {
      *value = lVar2;
      bVar3 = true;
    }
    close(__fd);
  }
  return bVar3;
}

Assistant:

bool ReadIntFromFile(const char* file, long* value) {
  bool ret = false;
  int fd = open(file, O_RDONLY);
  if (fd != -1) {
    char line[1024];
    char* err;
    memset(line, '\0', sizeof(line));
    CHECK(read(fd, line, sizeof(line) - 1));
    const long temp_value = strtol(line, &err, 10);
    if (line[0] != '\0' && (*err == '\n' || *err == '\0')) {
      *value = temp_value;
      ret = true;
    }
    close(fd);
  }
  return ret;
}